

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall node::anon_unknown_2::ChainImpl::isInMempool(ChainImpl *this,uint256 *txid)

{
  CTxMemPool *pCVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock37;
  unique_lock<std::recursive_mutex> local_50;
  GenTxid local_39;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (this->m_node->mempool)._M_t.
           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  if (pCVar1 == (CTxMemPool *)0x0) {
    bVar2 = false;
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_50,&pCVar1->cs,
               "m_node.mempool->cs",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
               ,0x29c,false);
    local_39.m_is_wtxid = false;
    local_39.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(txid->super_base_blob<256U>).m_data._M_elems;
    local_39.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((txid->super_base_blob<256U>).m_data._M_elems + 8);
    local_39.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((txid->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_39.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((txid->super_base_blob<256U>).m_data._M_elems + 0x18);
    bVar2 = CTxMemPool::exists((this->m_node->mempool)._M_t.
                               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                               .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&local_39);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool isInMempool(const uint256& txid) override
    {
        if (!m_node.mempool) return false;
        LOCK(m_node.mempool->cs);
        return m_node.mempool->exists(GenTxid::Txid(txid));
    }